

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sanitize.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4140::FlexFloatSanitizeTest_DoubleDenormal_Test::TestBody
          (FlexFloatSanitizeTest_DoubleDenormal_Test *this)

{
  char *message;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 local_38 [8];
  flexfloat_desc_t fStack_30;
  undefined6 uStack_2e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_18;
  
  fesetround(0xc00);
  local_38 = (undefined1  [8])&DAT_8000200000000000;
  fStack_30.exp_bits = '\x03';
  fStack_30.frac_bits = '\x03';
  flexfloat_sanitize((flexfloat_t *)local_38);
  local_18.v._10_6_ = uStack_2e;
  local_18.v.desc = fStack_30;
  local_18.v.value = (fp_t)local_38;
  bitstring<(unsigned_char)3,(unsigned_char)3>((string *)local_38,&local_18);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            (local_48,"\"1-000-000\"","bitstring(ff_val)",(char (*) [10])"1-000-000",
             (string *)local_38);
  if (local_38 != (undefined1  [8])&local_28) {
    operator_delete((void *)local_38,local_28._M_allocated_capacity + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/sanitize.cpp"
               ,0x67,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_38 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_38 + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST(FlexFloatSanitizeTest, DoubleDenormal) {
    fesetround(FE_TOWARDZERO);
    const double val = -1.73833895195875108053924431042E-310;
    flexfloat<3, 3> ff_val;
    ff_val = val;
    EXPECT_EQ("1-000-000", bitstring(ff_val));
}